

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_avx2.h
# Opt level: O0

void xy_y_convolve_6tap_8x2_avx2(int16_t *src,__m256i *ss_256,__m256i *coeffs,__m256i *r)

{
  undefined1 auVar1 [32];
  __m256i *coeffs_00;
  __m256i *ss;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 (*pauVar4) [32];
  undefined8 *in_RSI;
  long in_RDI;
  __m256i s_256 [2];
  
  pauVar4 = (undefined1 (*) [32])(in_RDI + 0x40);
  coeffs_00 = *(__m256i **)*pauVar4;
  ss = *(__m256i **)(in_RDI + 0x48);
  auVar2 = *pauVar4;
  auVar3 = *(undefined1 (*) [32])(in_RDI + 0x50);
  auVar1 = vpunpcklwd_avx2(*pauVar4,*(undefined1 (*) [32])(in_RDI + 0x50));
  *(undefined1 (*) [32])(in_RSI + 8) = auVar1;
  auVar1 = vpunpckhwd_avx2(auVar2,auVar3);
  *(undefined1 (*) [32])(in_RSI + 0x14) = auVar1;
  xy_y_convolve_6tap_16_avx2(ss,coeffs_00,(__m256i *)0x9a7f76);
  *in_RSI = in_RSI[4];
  in_RSI[1] = in_RSI[5];
  in_RSI[2] = in_RSI[6];
  in_RSI[3] = in_RSI[7];
  in_RSI[4] = in_RSI[8];
  in_RSI[5] = in_RSI[9];
  in_RSI[6] = in_RSI[10];
  in_RSI[7] = in_RSI[0xb];
  in_RSI[0xc] = in_RSI[0x10];
  in_RSI[0xd] = in_RSI[0x11];
  in_RSI[0xe] = in_RSI[0x12];
  in_RSI[0xf] = in_RSI[0x13];
  in_RSI[0x10] = in_RSI[0x14];
  in_RSI[0x11] = in_RSI[0x15];
  in_RSI[0x12] = in_RSI[0x16];
  in_RSI[0x13] = in_RSI[0x17];
  return;
}

Assistant:

static inline void xy_y_convolve_6tap_8x2_avx2(const int16_t *const src,
                                               __m256i ss_256[6],
                                               const __m256i coeffs[3],
                                               __m256i r[2]) {
  __m256i s_256[2];
  s_256[0] = _mm256_loadu_si256((__m256i *)(src + 4 * 8));
  s_256[1] = _mm256_loadu_si256((__m256i *)(src + 5 * 8));
  ss_256[2] = _mm256_unpacklo_epi16(s_256[0], s_256[1]);
  ss_256[5] = _mm256_unpackhi_epi16(s_256[0], s_256[1]);
  xy_y_convolve_6tap_16_avx2(ss_256, coeffs, r);
  ss_256[0] = ss_256[1];
  ss_256[1] = ss_256[2];
  ss_256[3] = ss_256[4];
  ss_256[4] = ss_256[5];
}